

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xdg_utils.hpp
# Opt level: O0

string * xdg_utils::data::home_abi_cxx11_(void)

{
  bool bVar1;
  string *in_RDI;
  initializer_list<char> local_c8;
  allocator<char> local_b1;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  allocator<char> local_39;
  string local_38;
  undefined1 local_11;
  string *path;
  
  local_11 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
  env::get(in_RDI,(string *)XDG_DATA_HOME_abi_cxx11_,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  bVar1 = is_absolute_path(in_RDI);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"HOME",&local_b1);
    env::get(&local_90,&local_b0);
    std::operator+(&local_70,&local_90,"/.local/share");
    std::__cxx11::string::operator=((string *)in_RDI,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator(&local_b1);
  }
  bVar1 = is_absolute_path(in_RDI);
  if (!bVar1) {
    std::initializer_list<char>::initializer_list(&local_c8);
    std::__cxx11::string::operator=((string *)in_RDI,local_c8._M_array,local_c8._M_len);
  }
  return in_RDI;
}

Assistant:

std::string home() {
  auto path = env::get(XDG_DATA_HOME, "");

  if (!is_absolute_path(path)) {
    path = env::get(HOME) + XDG_DATA_HOME_SUFFIX;
  }

  if (!is_absolute_path(path))
    path = {};

  return path;
}